

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unknown_field_set_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::anon_unknown_0::UnknownFieldSetTest_WrongTypeTreatedAsUnknownViaReflection_Test::
TestBody(UnknownFieldSetTest_WrongTypeTreatedAsUnknownViaReflection_Test *this)

{
  bool bVar1;
  int size;
  void *data;
  char *pcVar2;
  char *in_R9;
  AssertHelper local_510;
  Message local_508;
  string local_500;
  string local_4e0;
  undefined1 local_4c0 [8];
  AssertionResult gtest_ar;
  AssertHelper local_490;
  Message local_488;
  string_view local_480;
  bool local_469;
  undefined1 local_468 [8];
  AssertionResult gtest_ar__1;
  string local_450;
  AssertHelper local_430;
  Message local_428;
  bool local_419;
  undefined1 local_418 [8];
  AssertionResult gtest_ar_;
  CodedInputStream input;
  ArrayInputStream raw_input;
  string bizarro_data;
  undefined1 local_368 [8];
  TestEmptyMessage empty_message;
  TestAllTypes all_types_message;
  UnknownFieldSetTest_WrongTypeTreatedAsUnknownViaReflection_Test *this_local;
  
  proto2_unittest::TestAllTypes::TestAllTypes
            ((TestAllTypes *)&empty_message.super_ZeroFieldsBase._impl_);
  proto2_unittest::TestEmptyMessage::TestEmptyMessage((TestEmptyMessage *)local_368);
  UnknownFieldSetTest::GetBizarroData_abi_cxx11_
            ((string *)&raw_input.position_,&this->super_UnknownFieldSetTest);
  data = (void *)std::__cxx11::string::data();
  size = std::__cxx11::string::size();
  protobuf::io::ArrayInputStream::ArrayInputStream
            ((ArrayInputStream *)&input.extension_factory_,data,size,-1);
  protobuf::io::CodedInputStream::CodedInputStream
            ((CodedInputStream *)&gtest_ar_.message_,
             (ZeroCopyInputStream *)&input.extension_factory_);
  local_419 = internal::WireFormat::ParseAndMergePartial
                        ((CodedInputStream *)&gtest_ar_.message_,
                         (Message *)&empty_message.super_ZeroFieldsBase._impl_);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_418,&local_419,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_418);
  if (!bVar1) {
    testing::Message::Message(&local_428);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_450,(internal *)local_418,
               (AssertionResult *)"WireFormat::ParseAndMergePartial(&input, &all_types_message)",
               "false","true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_430,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/unknown_field_set_unittest.cc"
               ,0x1f5,pcVar2);
    testing::internal::AssertHelper::operator=(&local_430,&local_428);
    testing::internal::AssertHelper::~AssertHelper(&local_430);
    std::__cxx11::string::~string((string *)&local_450);
    testing::Message::~Message(&local_428);
  }
  gtest_ar__1.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._5_3_ = 0;
  gtest_ar__1.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._4_1_ = !bVar1;
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_418);
  if (gtest_ar__1.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._4_4_ == 0) {
    local_480 = (string_view)
                std::__cxx11::string::operator_cast_to_basic_string_view
                          ((string *)&raw_input.position_);
    local_469 = protobuf::MessageLite::ParseFromString((MessageLite *)local_368,local_480);
    testing::AssertionResult::AssertionResult<bool>
              ((AssertionResult *)local_468,&local_469,(type *)0x0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_468);
    if (!bVar1) {
      testing::Message::Message(&local_488);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)&gtest_ar.message_,(internal *)local_468,
                 (AssertionResult *)"empty_message.ParseFromString(bizarro_data)","false","true",
                 in_R9);
      pcVar2 = (char *)std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                (&local_490,kFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/unknown_field_set_unittest.cc"
                 ,0x1f6,pcVar2);
      testing::internal::AssertHelper::operator=(&local_490,&local_488);
      testing::internal::AssertHelper::~AssertHelper(&local_490);
      std::__cxx11::string::~string((string *)&gtest_ar.message_);
      testing::Message::~Message(&local_488);
    }
    gtest_ar__1.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl._5_3_ = 0;
    gtest_ar__1.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl._4_1_ = !bVar1;
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_468);
    if (gtest_ar__1.message_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl._4_4_ == 0) {
      Message::DebugString_abi_cxx11_(&local_4e0,(Message *)local_368);
      Message::DebugString_abi_cxx11_
                (&local_500,(Message *)&empty_message.super_ZeroFieldsBase._impl_);
      testing::internal::EqHelper::
      Compare<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nullptr>
                ((EqHelper *)local_4c0,"empty_message.DebugString()",
                 "all_types_message.DebugString()",&local_4e0,&local_500);
      std::__cxx11::string::~string((string *)&local_500);
      std::__cxx11::string::~string((string *)&local_4e0);
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_4c0);
      if (!bVar1) {
        testing::Message::Message(&local_508);
        pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_4c0);
        testing::internal::AssertHelper::AssertHelper
                  (&local_510,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/unknown_field_set_unittest.cc"
                   ,0x1f8,pcVar2);
        testing::internal::AssertHelper::operator=(&local_510,&local_508);
        testing::internal::AssertHelper::~AssertHelper(&local_510);
        testing::Message::~Message(&local_508);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_4c0);
      gtest_ar__1.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._4_4_ = 0;
    }
  }
  protobuf::io::CodedInputStream::~CodedInputStream((CodedInputStream *)&gtest_ar_.message_);
  protobuf::io::ArrayInputStream::~ArrayInputStream((ArrayInputStream *)&input.extension_factory_);
  std::__cxx11::string::~string((string *)&raw_input.position_);
  proto2_unittest::TestEmptyMessage::~TestEmptyMessage((TestEmptyMessage *)local_368);
  proto2_unittest::TestAllTypes::~TestAllTypes
            ((TestAllTypes *)&empty_message.super_ZeroFieldsBase._impl_);
  return;
}

Assistant:

TEST_F(UnknownFieldSetTest, WrongTypeTreatedAsUnknownViaReflection) {
  // Same as WrongTypeTreatedAsUnknown but via the reflection interface.

  unittest::TestAllTypes all_types_message;
  unittest::TestEmptyMessage empty_message;
  std::string bizarro_data = GetBizarroData();
  io::ArrayInputStream raw_input(bizarro_data.data(), bizarro_data.size());
  io::CodedInputStream input(&raw_input);
  ASSERT_TRUE(WireFormat::ParseAndMergePartial(&input, &all_types_message));
  ASSERT_TRUE(empty_message.ParseFromString(bizarro_data));

  EXPECT_EQ(empty_message.DebugString(), all_types_message.DebugString());
}